

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form7_Threshold(ThresholdDoubleForm3 Threshold)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  code *in_RDI;
  uint uVar5;
  Image output;
  uint8_t maxThreshold;
  uint8_t minThreshold;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  uint8_t intensity;
  undefined4 in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  uint32_t in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  uchar in_stack_ffffffffffffff36;
  uint8_t in_stack_ffffffffffffff37;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff41;
  undefined1 in_stack_ffffffffffffff42;
  undefined1 in_stack_ffffffffffffff43;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  undefined4 uVar6;
  uint32_t height;
  uint32_t in_stack_ffffffffffffff58;
  uint8_t in_stack_ffffffffffffff5f;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined1 local_60 [40];
  undefined1 local_38 [47];
  byte local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  uVar4 = (uint)local_9;
  height = (uint32_t)((ulong)local_60 >> 0x20);
  uVar6 = 0;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46,
                               CONCAT15(in_stack_ffffffffffffff45,
                                        CONCAT14(in_stack_ffffffffffffff44,
                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                          CONCAT12(in_stack_ffffffffffffff42,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
             in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,in_stack_ffffffffffffff37,
             in_stack_ffffffffffffff36);
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58,height,
             (Image *)CONCAT44(uVar6,uVar4));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e54ff);
  Unit_Test::generateRoi
            ((Image *)CONCAT17(in_stack_ffffffffffffff47,
                               CONCAT16(in_stack_ffffffffffffff46,
                                        CONCAT15(in_stack_ffffffffffffff45,
                                                 CONCAT14(in_stack_ffffffffffffff44,
                                                          CONCAT13(in_stack_ffffffffffffff43,
                                                                   CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (uint32_t *)0x1e5520);
  bVar1 = Test_Helper::randomValue<unsigned_char>(0x1e552c);
  bVar2 = Test_Helper::randomValue<unsigned_char>
                    (in_stack_ffffffffffffff36,in_stack_ffffffffffffff30);
  uVar5 = (uint)bVar2;
  uVar4 = (uint)bVar1;
  (*local_8)(&stack0xffffffffffffff58,local_38,local_70,local_74,local_78,local_7c);
  bVar3 = Unit_Test::equalSize
                    ((Image *)CONCAT17(in_stack_ffffffffffffff37,
                                       CONCAT16(in_stack_ffffffffffffff36,
                                                CONCAT24(in_stack_ffffffffffffff34,uVar5))),
                     in_stack_ffffffffffffff2c,uVar4);
  bVar1 = false;
  if (bVar3) {
    bVar1 = Unit_Test::verifyImage
                      ((Image *)CONCAT17(in_stack_ffffffffffffff37,
                                         CONCAT16(in_stack_ffffffffffffff36,
                                                  CONCAT24(in_stack_ffffffffffffff34,uVar5))),
                       (uint8_t)(in_stack_ffffffffffffff2c >> 0x18));
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e5629);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e5636);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form7_Threshold(ThresholdDoubleForm3 Threshold)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const uint8_t minThreshold = randomValue <uint8_t>( 255 );
        const uint8_t maxThreshold = randomValue <uint8_t>( minThreshold, 255 );

        const PenguinV_Image::Image output = Threshold( input, roiX, roiY, roiWidth, roiHeight, minThreshold, maxThreshold );

        return equalSize( output, roiWidth, roiHeight ) &&
            verifyImage( output, intensity < minThreshold || intensity > maxThreshold ? 0 : 255 );
    }